

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test::TestBody
          (RepeatedField_NaturalGrowthOnArenasReuseBlocks_Test *this)

{
  RepeatedField<int> *this_00;
  int j;
  int value;
  char *message;
  int i;
  int iVar1;
  undefined1 auVar2 [16];
  AssertHelper local_120;
  Message local_118;
  long local_110;
  AssertionResult gtest_ar;
  vector<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  values;
  Arena arena;
  
  internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  values.
  super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  values.
  super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar1 = 0; iVar1 != 100; iVar1 = iVar1 + 1) {
    gtest_ar._0_8_ =
         Arena::DoCreateMessage<google::protobuf::RepeatedField<int>>((Arena *)&arena.impl_);
    std::
    vector<google::protobuf::RepeatedField<int>*,std::allocator<google::protobuf::RepeatedField<int>*>>
    ::emplace_back<google::protobuf::RepeatedField<int>*>
              ((vector<google::protobuf::RepeatedField<int>*,std::allocator<google::protobuf::RepeatedField<int>*>>
                *)&values,(RepeatedField<int> **)&gtest_ar);
    this_00 = values.
              super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
    for (value = 0; value != 1000; value = value + 1) {
      RepeatedField<int>::Add(this_00,value);
    }
  }
  local_110 = 2;
  if ((undefined1  [16])
      ((undefined1  [16])
       ((*values.
          super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
          ._M_impl.super__Vector_impl_data._M_start)->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    local_110 = (long)((*values.
                         super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->soo_rep_).field_0.long_rep.
                      capacity;
  }
  local_110 = ((long)values.
                     super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)values.
                     super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 1) * local_110;
  auVar2._8_4_ = (int)((ulong)local_110 >> 0x20);
  auVar2._0_8_ = local_110;
  auVar2._12_4_ = 0x45300000;
  local_118.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_110) - 4503599627370496.0)) * 1.02);
  local_120.data_ = (AssertHelperData *)internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::internal::GeMatcher<unsigned_long>,testing::internal::LeMatcher<double>>>
  ::operator()(&gtest_ar,(char *)&local_118,(unsigned_long *)"arena.SpaceUsed()");
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xf5,message);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if (local_118.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_118.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  _Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
  ::~_Vector_base(&values.
                   super__Vector_base<google::protobuf::RepeatedField<int>_*,_std::allocator<google::protobuf::RepeatedField<int>_*>_>
                 );
  internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  return;
}

Assistant:

TEST(RepeatedField, NaturalGrowthOnArenasReuseBlocks) {
  Arena arena;
  std::vector<RepeatedField<int>*> values;

  static constexpr int kNumFields = 100;
  static constexpr int kNumElems = 1000;
  for (int i = 0; i < kNumFields; ++i) {
    values.push_back(Arena::Create<RepeatedField<int>>(&arena));
    auto& field = *values.back();
    for (int j = 0; j < kNumElems; ++j) {
      field.Add(j);
    }
  }

  size_t expected = values.size() * values[0]->Capacity() * sizeof(int);
  // Use a 2% slack for other overhead. If we were not reusing the blocks, the
  // actual value would be ~2x the expected.
  EXPECT_THAT(arena.SpaceUsed(), AllOf(Ge(expected), Le(1.02 * expected)));
}